

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::
Section9ValidRequireExplicitPolicyTest1<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section9ValidRequireExplicitPolicyTest1
          (Section9ValidRequireExplicitPolicyTest1<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest09RequireExplicitPolicy,
                     Section9ValidRequireExplicitPolicyTest1) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "requireExplicitPolicy10CACert",
                               "requireExplicitPolicy10subCACert",
                               "requireExplicitPolicy10subsubCACert",
                               "requireExplicitPolicy10subsubsubCACert",
                               "ValidrequireExplicitPolicyTest1EE"};
  const char* const crls[] = {
      "TrustAnchorRootCRL", "requireExplicitPolicy10CACRL",
      "requireExplicitPolicy10subCACRL", "requireExplicitPolicy10subsubCACRL",
      "requireExplicitPolicy10subsubsubCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.9.1";
  info.should_validate = true;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}